

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

bool __thiscall
QCompletionEngine::lookupCache
          (QCompletionEngine *this,QString *part,QModelIndex *parent,QMatchData *m)

{
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((part->d).size != 0) {
    cVar2 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::find(&this->cache,parent);
    cVar3._M_node = (_Base_ptr)(this->cache).d.d.ptr;
    if ((QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
         *)cVar3._M_node !=
        (QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
         *)0x0) {
      cVar3._M_node =
           &(((QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
               *)cVar3._M_node)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    if (cVar2.i._M_node != (const_iterator)cVar3._M_node) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if (this->c->cs == CaseInsensitive) {
        QString::toLower_helper((QString *)&local_48);
      }
      else {
        local_48.d = (part->d).d;
        local_48.ptr = (part->d).ptr;
        local_48.size = (part->d).size;
        if (local_48.d != (Data *)0x0) {
          LOCK();
          ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      cVar4 = QMap<QString,_QMatchData>::find
                        ((QMap<QString,_QMatchData> *)((long)cVar2.i._M_node + 0x38),
                         (QString *)&local_48);
      pQVar1 = (((QMap<QString,_QMatchData> *)((long)cVar2.i._M_node + 0x38))->d).d.ptr;
      cVar5._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                     *)0x0) {
        cVar5._M_node = (_Base_ptr)0x0;
      }
      bVar6 = cVar4.i._M_node != (const_iterator)cVar5._M_node;
      if (bVar6) {
        QMatchData::operator=(m,(QMatchData *)((long)cVar4.i._M_node + 0x38));
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      goto LAB_005d1941;
    }
  }
  bVar6 = false;
LAB_005d1941:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QCompletionEngine::lookupCache(const QString &part, const QModelIndex &parent, QMatchData *m) const
{
    if (part.isEmpty())
        return false; // early out to avoid cache[parent] lookup costs

    const auto cit = cache.find(parent);
    if (cit == cache.end())
        return false;

    const CacheItem& map = *cit;

    const QString key = c->cs == Qt::CaseInsensitive ? part.toLower() : part;

    const auto it = map.find(key);
    if (it == map.end())
        return false;

    *m = it.value();
    return true;
}